

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
::LookupBucketFor<llbuild::core::CancellationDelegate*>
          (DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>,llbuild::core::CancellationDelegate*,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llbuild::core::CancellationDelegate*>,llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate*>>
           *this,CancellationDelegate **Val,
          DenseSetPair<llbuild::core::CancellationDelegate_*> **FoundBucket)

{
  CancellationDelegate *pCVar1;
  bool bVar2;
  uint uVar3;
  CancellationDelegate *pCVar4;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar5;
  uint uVar6;
  ulong uVar7;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar8;
  int iVar9;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar5 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
LAB_0016462c:
    bVar2 = false;
  }
  else {
    pCVar1 = *Val;
    if (((ulong)pCVar1 | 8) == 0xfffffffffffffff8) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>, KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, BucketT = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, LookupKeyT = llbuild::core::CancellationDelegate *]"
                   );
    }
    uVar3 = *(int *)(this + 0x10) - 1;
    uVar7 = (ulong)(((uint)((ulong)pCVar1 >> 9) & 0x7fffff ^ (uint)((ulong)pCVar1 >> 4) & 0xfffffff)
                   & uVar3);
    pDVar5 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)(*(long *)this + uVar7 * 8);
    pCVar4 = pDVar5->key;
    bVar2 = true;
    if (pCVar1 != pCVar4) {
      iVar9 = 1;
      pDVar8 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0;
      do {
        if (pCVar4 == (CancellationDelegate *)0xfffffffffffffff8) {
          if (pDVar8 != (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
            pDVar5 = pDVar8;
          }
          goto LAB_0016462c;
        }
        if (pCVar4 == (CancellationDelegate *)0xfffffffffffffff0 &&
            pDVar8 == (DenseSetPair<llbuild::core::CancellationDelegate_*> *)0x0) {
          pDVar8 = pDVar5;
        }
        uVar6 = (int)uVar7 + iVar9;
        iVar9 = iVar9 + 1;
        uVar7 = (ulong)(uVar6 & uVar3);
        pDVar5 = (DenseSetPair<llbuild::core::CancellationDelegate_*> *)(*(long *)this + uVar7 * 8);
        pCVar4 = pDVar5->key;
      } while (pCVar1 != pCVar4);
    }
  }
  *FoundBucket = pDVar5;
  return bVar2;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }